

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

size_t despace32(char *bytes,size_t howmany)

{
  ulong uStack_28;
  char c;
  size_t i;
  size_t pos;
  size_t howmany_local;
  char *bytes_local;
  
  i = 0;
  for (uStack_28 = 0; uStack_28 < howmany; uStack_28 = uStack_28 + 1) {
    if (0x20 < (byte)bytes[uStack_28]) {
      bytes[i] = bytes[uStack_28];
      i = i + 1;
    }
  }
  return i;
}

Assistant:

size_t despace32(char *bytes, size_t howmany) {
  size_t pos = 0;
  for (size_t i = 0; i < howmany; i++) {
    char c = bytes[i];
    if ((unsigned char)c <= 32) {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}